

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::MeshLoader::appendVertexValues
          (MeshLoader *this,SourceBase *sourceBase,MeshVertexData *vertexData)

{
  int iVar1;
  size_t sVar2;
  long *plVar3;
  
  sVar2 = COLLADAFW::FloatOrDoubleArray::getValuesCount(&vertexData->super_FloatOrDoubleArray);
  sourceBase->mInitialIndex = sVar2;
  iVar1 = (*sourceBase->_vptr_SourceBase[2])(sourceBase);
  if (iVar1 == 3) {
    COLLADAFW::MeshVertexData::appendValues
              (vertexData,(DoubleArray *)&sourceBase[1].mLoadedInputElements.mFlags,&sourceBase->mId
               ,sourceBase->mStride);
  }
  else {
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Source has an other datatype as float or double! ",0x31);
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      return false;
    }
    COLLADAFW::MeshVertexData::appendValues
              (vertexData,(FloatArray *)&sourceBase[1].mLoadedInputElements.mFlags,&sourceBase->mId,
               sourceBase->mStride);
  }
  return true;
}

Assistant:

bool MeshLoader::appendVertexValues ( 
        SourceBase* sourceBase, 
        COLLADAFW::MeshVertexData &vertexData )
    {
        bool retValue = true;

        // Check if there are already some values in the positions list.
        // If so, we have to store the last index to increment the following indexes.
        const size_t initialIndex = vertexData.getValuesCount ();
        sourceBase->setInitialIndex ( initialIndex );

        // Get the source input array
        const SourceBase::DataType& dataType = sourceBase->getDataType ();
        switch ( dataType )
        {
        case SourceBase::DATA_TYPE_FLOAT:
            {
                // Get the values array from the source
                FloatSource* source = ( FloatSource* ) sourceBase;
                FloatArrayElement& arrayElement = source->getArrayElement ();
                COLLADAFW::ArrayPrimitiveType<float>& valuesArray = arrayElement.getValues ();

                // Push the values with the infos into the list.
                vertexData.appendValues ( valuesArray, source->getId (), (size_t) source->getStride () );

                break;  
            }
        case SourceBase::DATA_TYPE_DOUBLE:
            {
                // Get the values array from the source
                DoubleSource* source = ( DoubleSource* ) sourceBase;
                DoubleArrayElement& arrayElement = source->getArrayElement ();
                COLLADAFW::ArrayPrimitiveType<double>& valuesArray = arrayElement.getValues ();

                // Push the values with the infos into the list.
                vertexData.appendValues ( valuesArray, source->getId (), (size_t) source->getStride () );

                break;
            }
        default:
            std::cerr << "Source has an other datatype as float or double! " << dataType << std::endl;
            retValue = false;
        }

        return retValue;
    }